

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Config::~Config(Config *this)

{
  streambuf *psVar1;
  pointer pcVar2;
  
  (this->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__Config_001618a8;
  std::ios::rdbuf((streambuf *)(&this->m_os + *(long *)(*(long *)&this->m_os + -0x18)));
  if ((this->m_stream).isOwned == true) {
    psVar1 = (this->m_stream).streamBuf;
    if (psVar1 != (streambuf *)0x0) {
      (**(code **)(*(long *)psVar1 + 8))();
    }
    (this->m_stream).streamBuf = (streambuf *)0x0;
    (this->m_stream).isOwned = false;
  }
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::~vector
            (&this->m_filterSets);
  std::ios_base::~ios_base((ios_base *)&this->field_0xd8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->m_data).testsOrTags);
  pcVar2 = (this->m_data).processName._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_data).processName.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->m_data).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_data).name.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->m_data).outputFilename._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_data).outputFilename.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->m_data).reporterName._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_data).reporterName.field_2) {
    operator_delete(pcVar2);
  }
  IReporter::~IReporter((IReporter *)this);
  return;
}

Assistant:

virtual ~Config() {
            m_os.rdbuf( std::cout.rdbuf() );
            m_stream.release();
        }